

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_sqlite.cpp
# Opt level: O1

void __thiscall
QSQLiteDriver::handleNotification(QSQLiteDriver *this,QString *tableName,qint64 rowid)

{
  char cVar1;
  long in_FS_OFFSET;
  QStringView QVar2;
  QVariant QStack_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  QVar2.m_data = (tableName->d).ptr;
  QVar2.m_size = (tableName->d).size;
  cVar1 = QtPrivate::QStringList_contains((QList *)(*(long *)(this + 8) + 200),QVar2,CaseSensitive);
  if (cVar1 != '\0') {
    QVariant::QVariant(&QStack_48,rowid);
    QSqlDriver::notification((QString *)this,(NotificationSource)tableName,(QVariant *)0x0);
    QVariant::~QVariant(&QStack_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSQLiteDriver::handleNotification(const QString &tableName, qint64 rowid)
{
    Q_D(const QSQLiteDriver);
    if (d->notificationid.contains(tableName))
        emit notification(tableName, QSqlDriver::UnknownSource, QVariant(rowid));
}